

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed_info.c
# Opt level: O1

void init_feed_info(feed_info_t *record)

{
  record->feed_publisher_name[0] = '\0';
  record->feed_publisher_url[0] = '\0';
  record->feed_lang[0] = '\0';
  record->feed_start_date[0] = '\0';
  record->feed_end_date[0] = '\0';
  record->feed_version[0] = '\0';
  record->feed_contact_email[0] = '\0';
  record->feed_contact_url[0] = '\0';
  return;
}

Assistant:

void init_feed_info(feed_info_t *record) {
    strcpy(record->feed_publisher_name, "");
    strcpy(record->feed_publisher_url, "");
    strcpy(record->feed_lang, "");
    strcpy(record->feed_start_date, "");
    strcpy(record->feed_end_date, "");
    strcpy(record->feed_version, "");
    strcpy(record->feed_contact_email, "");
    strcpy(record->feed_contact_url, "");
}